

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_struct_writer
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool pointers)

{
  int *piVar1;
  t_field *ptVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 in_register_00000009;
  string *prefix;
  t_cpp_generator *this_00;
  pointer pptVar6;
  string *suffix;
  string local_138;
  undefined4 local_114;
  string local_110;
  string local_f0;
  string name;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_114 = (undefined4)CONCAT71(in_register_00000009,pointers);
  iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  std::__cxx11::string::string((string *)&name,(string *)CONCAT44(extraout_var,iVar4));
  if (this->gen_templates_ == true) {
    t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_138);
    poVar5 = std::operator<<(poVar5,"template <class Protocol_>");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_110);
    poVar5 = std::operator<<(poVar5,"uint32_t ");
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_00,iVar4));
    poVar5 = std::operator<<(poVar5,"::write(Protocol_* oprot) const {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_138);
  }
  else {
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"uint32_t ");
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_01,iVar4));
    poVar5 = std::operator<<(poVar5,"::write(::apache::thrift::protocol::TProtocol* oprot) const {")
    ;
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_138);
  poVar5 = std::operator<<(poVar5,"uint32_t xfer = 0;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_138);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,
                           "::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"xfer += oprot->writeStructBegin(\"");
  poVar5 = std::operator<<(poVar5,(string *)&name);
  poVar5 = std::operator<<(poVar5,"\");");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  pptVar6 = (tstruct->members_in_id_order_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (pptVar6 ==
        (tstruct->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::operator<<(out,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_138);
      poVar5 = std::operator<<(poVar5,"xfer += oprot->writeFieldStop();");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_110);
      poVar5 = std::operator<<(poVar5,"xfer += oprot->writeStructEnd();");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_f0);
      poVar5 = std::operator<<(poVar5,"return xfer;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_138);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"}");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&name);
      return;
    }
    if ((*pptVar6)->req_ == T_OPTIONAL) {
LAB_00170cee:
      poVar5 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_138);
      poVar5 = std::operator<<(poVar5,"if (this->__isset.");
      poVar5 = std::operator<<(poVar5,(string *)&(*pptVar6)->name_);
      poVar5 = std::operator<<(poVar5,") {");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_138);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      bVar3 = true;
    }
    else {
      iVar4 = (*((*pptVar6)->type_->super_t_doc)._vptr_t_doc[0xc])();
      if ((char)iVar4 != '\0') goto LAB_00170cee;
      std::operator<<(out,(string *)&::endl_abi_cxx11_);
      bVar3 = false;
    }
    t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_138);
    poVar5 = std::operator<<(poVar5,"xfer += oprot->writeFieldBegin(");
    poVar5 = std::operator<<(poVar5,"\"");
    poVar5 = std::operator<<(poVar5,(string *)&(*pptVar6)->name_);
    this_00 = (t_cpp_generator *)0x2df5f6;
    poVar5 = std::operator<<(poVar5,"\", ");
    type_to_enum_abi_cxx11_(&local_110,this_00,(*pptVar6)->type_);
    poVar5 = std::operator<<(poVar5,(string *)&local_110);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(*pptVar6)->key_);
    poVar5 = std::operator<<(poVar5,");");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_138);
    if ((char)local_114 == '\0') {
LAB_00170e74:
      ptVar2 = *pptVar6;
      std::__cxx11::string::string((string *)&local_b0,"this->",(allocator *)&local_138);
      suffix = &local_70;
      std::__cxx11::string::string((string *)suffix,"",(allocator *)&local_110);
      prefix = &local_b0;
      generate_serialize_field(this,out,ptVar2,prefix,suffix);
    }
    else {
      iVar4 = (*((*pptVar6)->type_->super_t_doc)._vptr_t_doc[0xc])();
      if ((char)iVar4 != '\0') goto LAB_00170e74;
      ptVar2 = *pptVar6;
      std::__cxx11::string::string((string *)&local_90,"(*(this->",(allocator *)&local_138);
      suffix = &local_50;
      std::__cxx11::string::string((string *)suffix,"))",(allocator *)&local_110);
      prefix = &local_90;
      generate_serialize_field(this,out,ptVar2,prefix,suffix);
    }
    std::__cxx11::string::~string((string *)suffix);
    std::__cxx11::string::~string((string *)prefix);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"xfer += oprot->writeFieldEnd();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    if (bVar3) {
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::operator<<(poVar5,'}');
    }
    pptVar6 = pptVar6 + 1;
  } while( true );
}

Assistant:

void t_cpp_generator::generate_struct_writer(ostream& out, t_struct* tstruct, bool pointers) {
  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;

  if (gen_templates_) {
    out << indent() << "template <class Protocol_>" << endl << indent() << "uint32_t "
        << tstruct->get_name() << "::write(Protocol_* oprot) const {" << endl;
  } else {
    indent(out) << "uint32_t " << tstruct->get_name()
                << "::write(::apache::thrift::protocol::TProtocol* oprot) const {" << endl;
  }
  indent_up();

  out << indent() << "uint32_t xfer = 0;" << endl;

  indent(out) << "::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);" << endl;
  indent(out) << "xfer += oprot->writeStructBegin(\"" << name << "\");" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    bool check_if_set = (*f_iter)->get_req() == t_field::T_OPTIONAL
                        || (*f_iter)->get_type()->is_xception();
    if (check_if_set) {
      out << endl << indent() << "if (this->__isset." << (*f_iter)->get_name() << ") {" << endl;
      indent_up();
    } else {
      out << endl;
    }

    // Write field header
    out << indent() << "xfer += oprot->writeFieldBegin("
        << "\"" << (*f_iter)->get_name() << "\", " << type_to_enum((*f_iter)->get_type()) << ", "
        << (*f_iter)->get_key() << ");" << endl;
    // Write field contents
    if (pointers && !(*f_iter)->get_type()->is_xception()) {
      generate_serialize_field(out, *f_iter, "(*(this->", "))");
    } else {
      generate_serialize_field(out, *f_iter, "this->");
    }
    // Write field closer
    indent(out) << "xfer += oprot->writeFieldEnd();" << endl;
    if (check_if_set) {
      indent_down();
      indent(out) << '}';
    }
  }

  out << endl;

  // Write the struct map
  out << indent() << "xfer += oprot->writeFieldStop();" << endl << indent()
      << "xfer += oprot->writeStructEnd();" << endl << indent()
      << "return xfer;" << endl;

  indent_down();
  indent(out) << "}" << endl << endl;
}